

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompareDump.cpp
# Opt level: O2

void CompareOnTheFlyTexture(comparer_context *comp)

{
  scoped_chunk chunk;
  allocator<char> local_31;
  string local_30;
  scoped_chunk local_10;
  
  local_10.ctx = comp;
  comparer_context::push_elem(comp,"aiTexture");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"mWidth",&local_31);
  comparer_context::cmp<unsigned_int>(comp,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"mHeight",&local_31);
  comparer_context::cmp<unsigned_int>(comp,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"achFormatHint[0]",&local_31);
  comparer_context::cmp<char>(comp,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"achFormatHint[1]",&local_31);
  comparer_context::cmp<char>(comp,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"achFormatHint[2]",&local_31);
  comparer_context::cmp<char>(comp,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"achFormatHint[3]",&local_31);
  comparer_context::cmp<char>(comp,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  scoped_chunk::~scoped_chunk(&local_10);
  return;
}

Assistant:

void CompareOnTheFlyTexture(comparer_context& comp) {
    scoped_chunk chunk(comp,"aiTexture");

    const uint32_t w = comp.cmp<uint32_t>("mWidth");
    const uint32_t h = comp.cmp<uint32_t>("mHeight");
    (void)w; (void)h;
    comp.cmp<char>("achFormatHint[0]");
    comp.cmp<char>("achFormatHint[1]");
    comp.cmp<char>("achFormatHint[2]");
    comp.cmp<char>("achFormatHint[3]");
}